

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void RunBench(Benchmark *b,int nthread,int siz)

{
  uint n;
  int iVar1;
  int iVar2;
  char *__format;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  char suf [100];
  char mb [100];
  char local_f8 [112];
  char local_88 [104];
  
  if (nthread == 1) {
    uVar5 = 1;
    runN(b,1,siz);
    do {
      if (999999999 < ns) break;
      iVar2 = 1000000000;
      if (ns / (long)uVar5 != 0) {
        iVar2 = (int)(1000000000 / (long)(int)(ns / (long)uVar5));
      }
      iVar2 = iVar2 / 2 + iVar2;
      iVar1 = (int)uVar5 * 100;
      iVar3 = (int)uVar5 + 1;
      if (iVar1 < iVar2) {
        iVar2 = iVar1;
      }
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      n = 1;
      do {
        uVar4 = n;
        n = uVar4 * 10;
      } while ((int)n < iVar2);
      if (iVar2 < (int)(uVar4 * 5)) {
        n = uVar4 * 5;
      }
      if (iVar2 < (int)(uVar4 * 2)) {
        n = uVar4 * 2;
      }
      uVar5 = (ulong)n;
      runN(b,n,siz);
    } while (n < 1000000000);
    local_88[0] = '\0';
    local_f8[0] = '\0';
    if (0 < bytes && 0 < ns) {
      auVar6._0_8_ = ((double)((ulong)bytes >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25)
                     + (double)(bytes & 0xffffffffU | 0x4330000000000000);
      auVar6._8_8_ = ((double)((ulong)ns >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                     (double)(ns & 0xffffffffU | 0x4330000000000000);
      auVar6 = divpd(auVar6,_DAT_00147cc0);
      snprintf(local_88,100,"\t%7.2f MB/s",auVar6._0_8_ / auVar6._8_8_);
    }
    if ((b->fnr != (_func_void_int_int *)0x0) || (b->lo != b->hi)) {
      if (siz < 0x100000) {
        if (siz < 0x400) {
          __format = "/%d";
        }
        else {
          siz = (uint)siz >> 10;
          __format = "/%dK";
        }
      }
      else {
        siz = (uint)siz >> 0x14;
        __format = "/%dM";
      }
      snprintf(local_f8,100,__format,(ulong)(uint)siz);
    }
    printf("%s%s\t%8lld\t%10lld ns/op%s\n",b->name,local_f8,uVar5,ns / (long)uVar5,local_88);
    fflush(_stdout);
  }
  return;
}

Assistant:

void RunBench(Benchmark* b, int nthread, int siz) {
	int n, last;

	// TODO(rsc): Threaded benchmarks.
	if(nthread != 1)
		return;
	
	// run once in case it's expensive
	n = 1;
	runN(b, n, siz);
	while(ns < (int)1e9 && n < (int)1e9) {
		last = n;
		if(ns/n == 0)
			n = (int)1e9;
		else
			n = (int)1e9 / static_cast<int>(ns/n);
		
		n = max(last+1, min(n+n/2, 100*last));
		n = round(n);
		runN(b, n, siz);
	}
	
	char mb[100];
	char suf[100];
	mb[0] = '\0';
	suf[0] = '\0';
	if(ns > 0 && bytes > 0)
		snprintf(mb, sizeof mb, "\t%7.2f MB/s", ((double)bytes/1e6)/((double)ns/1e9));
	if(b->fnr || b->lo != b->hi) {
		if(siz >= (1<<20))
			snprintf(suf, sizeof suf, "/%dM", siz/(1<<20));
		else if(siz >= (1<<10))
			snprintf(suf, sizeof suf, "/%dK", siz/(1<<10));
		else
			snprintf(suf, sizeof suf, "/%d", siz);
	}
	printf("%s%s\t%8lld\t%10lld ns/op%s\n", b->name, suf, (long long)n, (long long)ns/n, mb);
	fflush(stdout);
}